

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O2

void __thiscall AlsavoSession::AlsavoSession(AlsavoSession *this)

{
  rep rVar1;
  
  *(undefined8 *)((long)&(this->m_ConnStatusCB).super__Function_base._M_functor + 0xc) = 0;
  *(undefined8 *)((long)&(this->m_ConnStatusCB).super__Function_base._M_manager + 4) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)&(this->m_ConnStatusCB).super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&(this->m_ConnStatusCB)._M_invoker + 4) = 0;
  CLI::std::
  _Deque_base<AlsavoSession::PacketQueueItem,_std::allocator<AlsavoSession::PacketQueueItem>_>::
  _Deque_base(&(this->m_OutQueue).
               super__Deque_base<AlsavoSession::PacketQueueItem,_std::allocator<AlsavoSession::PacketQueueItem>_>
             );
  (this->m_StatusHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_StatusHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_StatusHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_StatusHandler).super__Function_base._M_functor + 8) = 0;
  this->m_PacketTimeout = 1000.0;
  this->m_Sock = 0;
  (this->m_SerialNo)._M_dataplus._M_p = (pointer)&(this->m_SerialNo).field_2;
  (this->m_SerialNo)._M_string_length = 0;
  (this->m_SerialNo).field_2._M_local_buf[0] = '\0';
  (this->m_Password)._M_dataplus._M_p = (pointer)&(this->m_Password).field_2;
  (this->m_Password)._M_string_length = 0;
  (this->m_Password).field_2._M_local_buf[0] = '\0';
  this->m_ClientToken = 0;
  this->m_ServerToken = 0;
  this->m_CSID = 0;
  this->m_DSID = 0;
  this->m_NextSeq = 0;
  this->m_MaxRetries = 3;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->m_LastPacketRcvTime).__d.__r = rVar1;
  (this->m_LastConfigReqTime).__d.__r = 0;
  return;
}

Assistant:

AlsavoSession()
		: m_LastPacketRcvTime(std::chrono::system_clock::now())
		, m_ConnectionStatus(ConnectionStatus::Disconnected)
	{
#ifdef _MSC_VER
		WSADATA wsadata;
		WSAStartup(MAKEWORD(2, 2), &wsadata);
#endif
	}